

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

bool __thiscall CppJieba::MixSegment::dispose(MixSegment *this)

{
  bool bVar1;
  MPSegment *in_RDI;
  
  bVar1 = SegmentBase::_getInitFlag(&in_RDI->super_SegmentBase);
  if (bVar1) {
    MPSegment::dispose(in_RDI);
    HMMSegment::dispose((HMMSegment *)0x12c0bc);
    SegmentBase::_setInitFlag(&in_RDI->super_SegmentBase,false);
  }
  return true;
}

Assistant:

virtual bool dispose()
            {
                if(!_getInitFlag())
                {
                    return true;
                }
                _mpSeg.dispose();
                _hmmSeg.dispose();
                _setInitFlag(false);
                return true;
            }